

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O2

void __thiscall
QBlitterPaintEnginePrivate::updateCompleteState(QBlitterPaintEnginePrivate *this,QPainterState *s)

{
  (this->caps).capabillitiesState =
       (uint)(((s->pen).d.d.ptr)->style != NoPen) << 8 |
       (this->caps).capabillitiesState & 0xfffffeff;
  updateBrushState(this,s);
  (this->caps).capabillitiesState =
       (uint)(s->opacity <= 1.0 && s->opacity != 1.0) << 0xd |
       (this->caps).capabillitiesState & 0xffffdfff;
  updateCompositionModeState(this,s);
  (this->caps).capabillitiesState =
       ((s->renderHints).super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
        super_QFlagsStorage<QPainter::RenderHint>.i & 1) << 0xc |
       (this->caps).capabillitiesState & 0xffffefff;
  updateTransformState(this,s);
  updateClipState(this,s);
  return;
}

Assistant:

void QBlitterPaintEnginePrivate::updateCompleteState(QPainterState *s)
{
    updatePenState(s);
    updateBrushState(s);
    updateOpacityState(s);
    updateCompositionModeState(s);
    updateRenderHintsState(s);
    updateTransformState(s);
    updateClipState(s);
}